

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerspectiveMatrix.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar3;
  size_t j;
  long lVar4;
  float fVar5;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar6;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar9;
  float fVar10;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  Vec3f VVar15;
  string model_path;
  string texture_path;
  vector<int,_std::allocator<int>_> face;
  TGAImage texture;
  TGAImage framebuffer;
  Vec2f uv [3];
  Matrix projectMatrix;
  Matrix viewMatrix;
  TinyRender render;
  Vec3f triangle [3];
  Model model;
  long *local_240 [2];
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  vector<int,_std::allocator<int>_> local_200;
  TGAImage local_1e8;
  TGAImage local_1d0;
  Vec2f local_1b8;
  Vec2f local_1b0;
  Vec2f local_1a8;
  Matrix local_1a0;
  Matrix local_160;
  TinyRender local_120;
  Vec3f local_108 [4];
  Model local_d8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar11;
  
  TRM::TGAImage::TGAImage(&local_1d0,800,600,3);
  local_d8.verts_.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_1_ = 4;
  local_d8.verts_.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xff000000;
  TRM::TGAImage::clearColor(&local_1d0,(TGAColor *)&local_d8);
  local_120._vptr_TinyRender = (_func_int **)&PTR__TinyRender_0010ad00;
  local_120.mImage = (TGAImage *)0x0;
  local_120.mZBuffer = (float *)0x0;
  TRM::TinyRender::attachBuffer(&local_120,&local_1d0);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p,
             ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p + ASSETS_ROOT_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p,
             ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p + ASSETS_ROOT_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_220);
  TRM::Model::Model(&local_d8,(char *)local_240[0]);
  TRM::TGAImage::TGAImage(&local_1e8);
  TRM::TGAImage::read_tga_file(&local_1e8,(char *)local_220[0]);
  TRM::TGAImage::flip_vertically(&local_1e8);
  VVar15.field_2.z = 1.0;
  VVar15.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  VVar15.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  TRM::lookAt(&local_160,VVar15,(Vec3f)ZEXT812(0),(Vec3f)ZEXT812(0x3f80000000000000));
  fVar5 = TRM::degToRadian(60.0);
  TRM::perspective(&local_1a0,fVar5,1.3333334,0.1,1000.0);
  uVar2 = 0;
  while( true ) {
    iVar1 = TRM::Model::nfaces(&local_d8);
    if ((ulong)(long)iVar1 <= uVar2) break;
    iVar1 = (int)uVar2;
    TRM::Model::face(&local_200,&local_d8,iVar1);
    paVar3 = &local_108[0].field_2;
    lVar4 = 0;
    do {
      VVar15 = TRM::Model::vert(&local_d8,
                                local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar4]);
      aVar11 = VVar15.field_2;
      aVar6 = VVar15.field_0;
      aVar9 = VVar15.field_1;
      fVar12 = local_160.value[3].field_0.x + local_160.value[2].field_0.x * aVar11.z +
               local_160.value[0].field_0.x * aVar6.x + local_160.value[1].field_0.x * aVar9.y;
      fVar13 = local_160.value[3].field_2.z + local_160.value[2].field_2.z * aVar11.z +
               local_160.value[1].field_2.z * aVar9.y + local_160.value[0].field_2.z * aVar6.x;
      fVar5 = local_160.value[3].field_1.y + local_160.value[2].field_1.y * aVar11.z +
              local_160.value[0].field_1.y * aVar6.x + local_160.value[1].field_1.y * aVar9.y;
      fVar10 = local_160.value[3].field_3.w + local_160.value[2].field_3.w * aVar11.z +
               local_160.value[1].field_3.w * aVar9.y + local_160.value[0].field_3.w * aVar6.x;
      fVar14 = local_1a0.value[3].field_3.w * fVar10 + local_1a0.value[2].field_3.w * fVar13 +
               local_1a0.value[1].field_3.w * fVar5 + local_1a0.value[0].field_3.w * fVar12;
      auVar7._0_4_ = fVar10 * local_1a0.value[3].field_0.x + fVar13 * local_1a0.value[2].field_0.x +
                     fVar5 * local_1a0.value[1].field_0.x + fVar12 * local_1a0.value[0].field_0.x;
      auVar7._4_4_ = fVar10 * local_1a0.value[3].field_1.y + fVar13 * local_1a0.value[2].field_1.y +
                     fVar5 * local_1a0.value[1].field_1.y + fVar12 * local_1a0.value[0].field_1.y;
      auVar7._8_4_ = fVar10 * 0.0 + fVar13 * 0.0 + fVar5 * 0.0 + fVar12 * 0.0;
      auVar7._12_4_ = fVar10 * 0.0 + fVar13 * 0.0 + fVar5 * 0.0 + fVar12 * 0.0;
      auVar8._4_4_ = fVar14;
      auVar8._0_4_ = fVar14;
      auVar8._8_4_ = fVar14;
      auVar8._12_4_ = fVar14;
      auVar8 = divps(auVar7,auVar8);
      ((Vec3f *)(paVar3 + -2))->field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           ((auVar8._0_4_ + 1.0) * 800.0 * 0.5 + 0.5);
      ((Vec3f *)(paVar3 + -2))->field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           ((auVar8._4_4_ + 1.0) * 600.0 * 0.5 + 0.5);
      paVar3->z = fVar14;
      lVar4 = lVar4 + 1;
      paVar3 = paVar3 + 3;
    } while (lVar4 != 3);
    local_1b8 = TRM::Model::uv(&local_d8,iVar1,0);
    local_1b0 = TRM::Model::uv(&local_d8,iVar1,1);
    local_1a8 = TRM::Model::uv(&local_d8,iVar1,2);
    TRM::TinyRender::triangle(&local_120,local_108,&local_1b8,&local_1e8);
    if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar2 = uVar2 + 1;
  }
  TRM::TGAImage::flip_vertically(&local_1d0);
  TRM::TGAImage::write_png_stb(&local_1d0,"framebuffer.png");
  TRM::TGAImage::~TGAImage(&local_1e8);
  TRM::Model::~Model(&local_d8);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TRM::TGAImage::~TGAImage(&local_1d0);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {

    TGAImage framebuffer(WIDTH, HEIGHT, TGAImage::RGB);
    framebuffer.clearColor(TGAColor(0, 0, 0));

    TinyRender render;
    render.attachBuffer(&framebuffer);
    
    std::string model_path = ASSETS_ROOT + "/african_head.obj";
    std::string texture_path = ASSETS_ROOT + "/african_head_diffuse.tga";
    
    Model model(model_path.c_str());


    TGAImage texture;
    texture.read_tga_file(texture_path.c_str());
    texture.flip_vertically();

    Vec3f eye;
    eye[0] = 1.f;
    eye[1] = 0.f;
    eye[2] = 1.f;

    Vec3f center;
    center[0] = 0.f;
    center[1] = 0.f;
    center[2] = 0.f;
    TRM::Vec3f up;
    up[0] = 0.0f;
    up[1] = 1.f;
    up[2] = 0.f;

    Matrix viewMatrix = lookAt(eye, center, up);
    Matrix projectMatrix = perspective(degToRadian(60.0f), 4.f / 3.f, 0.1f, 1000.0f);

    /** draw all vertex triangle ***/
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::vector<int> face = model.face(i);
        Vec3f triangle[3];
        for(size_t j = 0; j < 3; j++) {
            Vec3f c = model.vert(face[j]);
            Vec4f cp;
            cp[0] = c[0];
            cp[1] = c[1];
            cp[2] = c[2];
            cp[3] = 1.f;
            Vec4f pr = projectMatrix * (viewMatrix * cp);
            c[0] = pr[0] / pr[3];
            c[1] = pr[1] / pr[3];
            c[2] = pr[3];

            c[0] = (c[0] + 1.f) * WIDTH / 2.f + .5f;
            c[1] = (c[1] + 1.f) * HEIGHT / 2.f + .5f;
            triangle[j][0] = c[0];
            triangle[j][1] = c[1];
            triangle[j][2] = c[2];
        }


        Vec2f uv[] = { model.uv(i, 0), model.uv(i, 1), model.uv(i, 2) };
        render.triangle(triangle, uv, &texture);
    }
    
    framebuffer.flip_vertically();
    framebuffer.write_png_stb("framebuffer.png");

    return 0;
}